

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O1

uint32_t __thiscall
duckdb::ParquetReader::ReadData
          (ParquetReader *this,TProtocol *iprot,data_ptr_t buffer,uint32_t buffer_size)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint32_t uVar2;
  ParquetEncryptionConfig *this_01;
  string *key;
  type encryption_util_p;
  
  if ((this->parquet_options).encryption_config.internal.
      super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    this_01 = shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator->
                        (&(this->parquet_options).encryption_config);
    key = ParquetEncryptionConfig::GetFooterKey_abi_cxx11_(this_01);
    encryption_util_p = shared_ptr<duckdb::EncryptionUtil,_true>::operator*(&this->encryption_util);
    uVar2 = ParquetCrypto::ReadData(iprot,buffer,buffer_size,key,encryption_util_p);
    return uVar2;
  }
  peVar1 = (iprot->ptrans_).
           super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this_00 = (iprot->ptrans_).
            super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  uVar2 = (*peVar1->_vptr_TTransport[6])(peVar1,buffer,(ulong)buffer_size);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return uVar2;
}

Assistant:

uint32_t ParquetReader::ReadData(duckdb_apache::thrift::protocol::TProtocol &iprot, const data_ptr_t buffer,
                                 const uint32_t buffer_size) {
	if (parquet_options.encryption_config) {
		return ParquetCrypto::ReadData(iprot, buffer, buffer_size, parquet_options.encryption_config->GetFooterKey(),
		                               *encryption_util);
	} else {
		return iprot.getTransport()->read(buffer, buffer_size);
	}
}